

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O1

void ucnv_toUWriteCodePoint_63
               (UConverter *cnv,UChar32 c,UChar **target,UChar *targetLimit,int32_t **offsets,
               int32_t sourceIndex,UErrorCode *pErrorCode)

{
  bool bVar1;
  UChar *pUVar2;
  int8_t iVar3;
  long lVar4;
  int32_t *piVar5;
  
  pUVar2 = *target;
  if (targetLimit <= pUVar2) goto LAB_001b7755;
  if (c < 0x10000) {
    *pUVar2 = (UChar)c;
    c = 0xffffffff;
LAB_001b772b:
    lVar4 = 2;
    bVar1 = false;
  }
  else {
    *pUVar2 = (short)((uint)c >> 10) + L'ퟀ';
    c = c & 0x3ffU | 0xdc00;
    if (targetLimit <= pUVar2 + 1) goto LAB_001b772b;
    pUVar2[1] = (UChar)c;
    lVar4 = 4;
    bVar1 = true;
    c = 0xffffffff;
  }
  pUVar2 = (UChar *)((long)pUVar2 + lVar4);
  if ((offsets != (int32_t **)0x0) && (piVar5 = *offsets, piVar5 != (int32_t *)0x0)) {
    *piVar5 = sourceIndex;
    if (bVar1) {
      piVar5[1] = sourceIndex;
      piVar5 = piVar5 + 2;
    }
    else {
      piVar5 = piVar5 + 1;
    }
    *offsets = piVar5;
  }
LAB_001b7755:
  *target = pUVar2;
  if (-1 < c) {
    if (cnv != (UConverter *)0x0) {
      if ((uint)c < 0x10000) {
        iVar3 = '\x01';
        lVar4 = 0x90;
      }
      else {
        cnv->UCharErrorBuffer[0] = (short)((uint)c >> 10) + L'ퟀ';
        c = c & 0x3ffU | 0xdc00;
        iVar3 = '\x02';
        lVar4 = 0x92;
      }
      *(short *)(cnv->toUBytes + lVar4 + -0x41) = (short)c;
      cnv->UCharErrorBufferLength = iVar3;
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteCodePoint(UConverter *cnv,
                       UChar32 c,
                       UChar **target, const UChar *targetLimit,
                       int32_t **offsets,
                       int32_t sourceIndex,
                       UErrorCode *pErrorCode) {
    UChar *t;
    int32_t *o;

    t=*target;

    if(t<targetLimit) {
        if(c<=0xffff) {
            *t++=(UChar)c;
            c=U_SENTINEL;
        } else /* c is a supplementary code point */ {
            *t++=U16_LEAD(c);
            c=U16_TRAIL(c);
            if(t<targetLimit) {
                *t++=(UChar)c;
                c=U_SENTINEL;
            }
        }

        /* write offsets */
        if(offsets!=NULL && (o=*offsets)!=NULL) {
            *o++=sourceIndex;
            if((*target+1)<t) {
                *o++=sourceIndex;
            }
            *offsets=o;
        }
    }

    *target=t;

    /* write overflow from c */
    if(c>=0) {
        if(cnv!=NULL) {
            int8_t i=0;
            U16_APPEND_UNSAFE(cnv->UCharErrorBuffer, i, c);
            cnv->UCharErrorBufferLength=i;
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}